

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

uint8_t * __thiscall
icu_63::Normalizer2Impl::decomposeShort
          (Normalizer2Impl *this,uint8_t *src,uint8_t *limit,UBool stopAtCompBoundary,
          UBool onlyContiguous,ReorderingBuffer *buffer,UErrorCode *errorCode)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  undefined2 uVar4;
  UCPTrie *trie;
  uint16_t *puVar5;
  UBool UVar6;
  char cVar7;
  uint16_t uVar8;
  uint uVar9;
  UChar32 UVar10;
  int iVar11;
  uint8_t uVar12;
  ulong uVar13;
  ReorderingBuffer **sLimit;
  ushort uVar14;
  byte *pbVar15;
  int iVar16;
  undefined7 in_register_00000081;
  byte *cpLimit;
  byte *unaff_R15;
  bool bVar17;
  bool bVar18;
  char16_t jamos [3];
  UChar local_46;
  short local_44;
  short local_42;
  ReorderingBuffer *local_40;
  undefined4 local_34;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    local_34 = (undefined4)CONCAT71(in_register_00000081,onlyContiguous);
    local_40 = buffer;
    do {
      if (limit <= src) {
        return src;
      }
      cpLimit = src + 1;
      bVar1 = *src;
      uVar9 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        if (cpLimit != limit) {
          uVar9 = (uint)bVar1;
          if (bVar1 < 0xe0) {
            if ((0xc1 < bVar1) && ((byte)(*cpLimit ^ 0x80) < 0x40)) {
              uVar9 = (uint)this->normTrie->index[uVar9 & 0x1f] + (*cpLimit ^ 0x80);
LAB_0028ed84:
              cpLimit = cpLimit + 1;
              goto LAB_0028ee18;
            }
          }
          else if (bVar1 < 0xf0) {
            bVar1 = *cpLimit;
            if (((((byte)" 000000000000\x1000"[uVar9 & 0xf] >> (bVar1 >> 5) & 1) != 0) &&
                (cpLimit = src + 2, cpLimit != limit)) && ((byte)(*cpLimit ^ 0x80) < 0x40)) {
              uVar9 = (uint)*(ushort *)
                             ((long)this->normTrie->index +
                             (ulong)((uVar9 & 0xf) * 0x80 + (bVar1 & 0x3f) * 2)) + (*cpLimit ^ 0x80)
              ;
              goto LAB_0028ed84;
            }
          }
          else if (bVar1 < 0xf5) {
            bVar1 = *cpLimit;
            if ((((((uint)(int)""[bVar1 >> 4] >> (uVar9 - 0xf0 & 0x1f) & 1) != 0) &&
                 (cpLimit = src + 2, cpLimit != limit)) &&
                (bVar2 = *cpLimit, (byte)(bVar2 + 0x80) < 0x40)) &&
               ((cpLimit = src + 3, cpLimit != limit && ((byte)(*cpLimit + 0x80) < 0x40)))) {
              uVar9 = bVar1 & 0x3f | (uVar9 - 0xf0) * 0x40;
              trie = this->normTrie;
              if (uVar9 < trie->shifted12HighStart) {
                uVar9 = ucptrie_internalSmallU8Index_63(trie,uVar9,bVar2 + 0x80,*cpLimit + 0x80);
              }
              else {
                uVar9 = trie->dataLength - 2;
              }
              goto LAB_0028ed84;
            }
          }
        }
        uVar9 = this->normTrie->dataLength - 1;
      }
LAB_0028ee18:
      uVar14 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)(int)uVar9 * 2);
      uVar9 = (uint)uVar14;
      pbVar15 = src;
      if (uVar14 < this->limitNoNo) {
        UVar10 = -1;
        if ((stopAtCompBoundary == '\0') || (bVar18 = true, this->minNoNoCompNoMaybeCC <= uVar14)) {
LAB_0028ee8b:
          uVar14 = (ushort)uVar9;
          if (uVar14 < this->minYesNo) {
            if (UVar10 < 0) {
              UVar10 = anon_unknown_20::codePointFromValidUTF8(src,cpLimit);
            }
            UVar6 = ReorderingBuffer::append(local_40,UVar10,'\0',errorCode);
            if (UVar6 == '\0') {
              bVar18 = true;
              pbVar15 = (byte *)0x0;
            }
            else {
LAB_0028f057:
              if ((stopAtCompBoundary == '\0') || ((uVar9 & 1) == 0)) {
LAB_0028f0b2:
                bVar18 = false;
                pbVar15 = unaff_R15;
              }
              else {
                bVar18 = true;
                pbVar15 = cpLimit;
                if (((char)local_34 != '\0') && (uVar14 != 1)) {
                  if (uVar14 < this->limitNoNo) {
                    bVar17 = *(ushort *)((long)this->extraData + (ulong)(uVar9 & 0xfffe)) < 0x200;
                  }
                  else {
                    bVar17 = (uVar14 & 6) < 3;
                  }
                  if (!bVar17) goto LAB_0028f0b2;
                }
              }
            }
          }
          else {
            if ((uVar14 == this->minYesNo) ||
               (uVar4 = this->minYesNoMappingsOnly, (uVar4 | 1) == uVar14)) {
              if (UVar10 < 0) {
                UVar10 = anon_unknown_20::codePointFromValidUTF8(src,cpLimit);
              }
              iVar11 = UVar10 + -0xac00;
              iVar16 = (int)((ulong)((long)iVar11 * -0x6db6db6d) >> 0x20) + UVar10 + -0xac00;
              iVar16 = (iVar16 >> 4) - (iVar16 >> 0x1f);
              local_44 = (short)iVar16 + (short)(iVar16 / 0x15) * -0x15 + 0x1161;
              local_46 = ((short)((ulong)((long)iVar11 * 0x6f74ae27) >> 0x28) -
                         (short)(iVar11 >> 0x1f)) + L'ᄀ';
              sLimit = (ReorderingBuffer **)&local_42;
              iVar11 = iVar11 + iVar16 * -0x1c;
              if (iVar11 != 0) {
                local_42 = (short)iVar11 + 0x11a7;
                sLimit = &local_40;
              }
              cVar7 = ReorderingBuffer::appendZeroCC(local_40,&local_46,(UChar *)sLimit,errorCode);
            }
            else {
              puVar5 = this->extraData;
              uVar13 = (ulong)(uVar9 & 0xfffe);
              uVar3 = *(ushort *)((long)puVar5 + uVar13);
              if ((char)uVar3 < '\0') {
                uVar12 = *(uint8_t *)((long)puVar5 + (uVar13 - 1));
              }
              else {
                uVar12 = '\0';
              }
              cVar7 = ReorderingBuffer::append
                                (local_40,(UChar *)((long)puVar5 + uVar13 + 2),uVar3 & 0x1f,'\x01',
                                 uVar12,(uint8_t)(uVar3 >> 8),errorCode);
            }
            if (cVar7 != '\0') goto LAB_0028f057;
            bVar18 = true;
            pbVar15 = (byte *)0x0;
          }
        }
      }
      else if (uVar14 < this->minMaybeYes) {
        bVar18 = true;
        if (stopAtCompBoundary == '\0') {
          UVar10 = anon_unknown_20::codePointFromValidUTF8(src,cpLimit);
          UVar10 = ((uint)(uVar14 >> 3) + UVar10) - (uint)this->centerNoNoDelta;
          uVar8 = getRawNorm16(this,UVar10);
          uVar9 = (uint)uVar8;
          goto LAB_0028ee8b;
        }
      }
      else {
        UVar10 = anon_unknown_20::codePointFromValidUTF8(src,cpLimit);
        uVar12 = (uint8_t)(uVar14 >> 1);
        if (uVar14 < 0xfc00) {
          uVar12 = '\0';
        }
        UVar6 = ReorderingBuffer::append(local_40,UVar10,uVar12,errorCode);
        bVar18 = UVar6 == '\0';
        pbVar15 = unaff_R15;
        if (bVar18) {
          pbVar15 = (byte *)0x0;
        }
      }
      src = cpLimit;
      unaff_R15 = pbVar15;
    } while (!bVar18);
  }
  else {
    pbVar15 = (byte *)0x0;
  }
  return pbVar15;
}

Assistant:

const uint8_t *
Normalizer2Impl::decomposeShort(const uint8_t *src, const uint8_t *limit,
                                UBool stopAtCompBoundary, UBool onlyContiguous,
                                ReorderingBuffer &buffer, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) {
        return nullptr;
    }
    while (src < limit) {
        const uint8_t *prevSrc = src;
        uint16_t norm16;
        UCPTRIE_FAST_U8_NEXT(normTrie, UCPTRIE_16, src, limit, norm16);
        // Get the decomposition and the lead and trail cc's.
        UChar32 c = U_SENTINEL;
        if (norm16 >= limitNoNo) {
            if (isMaybeOrNonZeroCC(norm16)) {
                // No boundaries around this character.
                c = codePointFromValidUTF8(prevSrc, src);
                if (!buffer.append(c, getCCFromYesOrMaybe(norm16), errorCode)) {
                    return nullptr;
                }
                continue;
            }
            // Maps to an isCompYesAndZeroCC.
            if (stopAtCompBoundary) {
                return prevSrc;
            }
            c = codePointFromValidUTF8(prevSrc, src);
            c = mapAlgorithmic(c, norm16);
            norm16 = getRawNorm16(c);
        } else if (stopAtCompBoundary && norm16 < minNoNoCompNoMaybeCC) {
            return prevSrc;
        }
        // norm16!=INERT guarantees that [prevSrc, src[ is valid UTF-8.
        // We do not see invalid UTF-8 here because
        // its norm16==INERT is normalization-inert,
        // so it gets copied unchanged in the fast path,
        // and we stop the slow path where invalid UTF-8 begins.
        U_ASSERT(norm16 != INERT);
        if (norm16 < minYesNo) {
            if (c < 0) {
                c = codePointFromValidUTF8(prevSrc, src);
            }
            // does not decompose
            if (!buffer.append(c, 0, errorCode)) {
                return nullptr;
            }
        } else if (isHangulLV(norm16) || isHangulLVT(norm16)) {
            // Hangul syllable: decompose algorithmically
            if (c < 0) {
                c = codePointFromValidUTF8(prevSrc, src);
            }
            char16_t jamos[3];
            if (!buffer.appendZeroCC(jamos, jamos+Hangul::decompose(c, jamos), errorCode)) {
                return nullptr;
            }
        } else {
            // The character decomposes, get everything from the variable-length extra data.
            const uint16_t *mapping = getMapping(norm16);
            uint16_t firstUnit = *mapping;
            int32_t length = firstUnit & MAPPING_LENGTH_MASK;
            uint8_t trailCC = (uint8_t)(firstUnit >> 8);
            uint8_t leadCC;
            if (firstUnit & MAPPING_HAS_CCC_LCCC_WORD) {
                leadCC = (uint8_t)(*(mapping-1) >> 8);
            } else {
                leadCC = 0;
            }
            if (!buffer.append((const char16_t *)mapping+1, length, TRUE, leadCC, trailCC, errorCode)) {
                return nullptr;
            }
        }
        if (stopAtCompBoundary && norm16HasCompBoundaryAfter(norm16, onlyContiguous)) {
            return src;
        }
    }
    return src;
}